

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timernu.c
# Opt level: O0

void al_stop_timer(ALLEGRO_TIMER *timer)

{
  long in_RDI;
  _AL_VECTOR *in_stack_00000008;
  
  if ((*(byte *)(in_RDI + 0x80) & 1) != 0) {
    al_lock_mutex((ALLEGRO_MUTEX *)0x17fb30);
    _al_vector_find_and_delete(in_stack_00000008,timer);
    *(undefined1 *)(in_RDI + 0x80) = 0;
    al_unlock_mutex((ALLEGRO_MUTEX *)0x17fb56);
  }
  return;
}

Assistant:

void al_stop_timer(ALLEGRO_TIMER *timer)
{
   ASSERT(timer);
   {
      if (!timer->started)
         return;

      al_lock_mutex(timers_mutex);
      {
         _al_vector_find_and_delete(&active_timers, &timer);
         timer->started = false;
      }
      al_unlock_mutex(timers_mutex);
   }
}